

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void kj::printStackTraceOnCrash(void)

{
  int iVar1;
  Fault f_1;
  Fault f;
  Fault local_d0;
  Fault local_c8;
  undefined8 uStack_c0;
  _union_1457 local_b8;
  ulong auStack_b0 [16];
  undefined4 local_30;
  sigaltstack local_20;
  
  local_20.ss_flags = 0;
  local_20._12_4_ = 0;
  local_20.ss_size = 0x10000;
  local_20.ss_sp = mmap((void *)0x0,0x10000,3,0x122,-1,0);
  do {
    iVar1 = sigaltstack(&local_20,(sigaltstack *)0x0);
    if (-1 < iVar1) goto LAB_004a2bdd;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c8.exception = (Exception *)0x0;
    local_b8.sa_handler = (__sighandler_t)0x0;
    auStack_b0[0] = 0;
    _::Debug::Fault::init
              (&local_c8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c8);
  }
LAB_004a2bdd:
  memset(auStack_b0,0,0x90);
  local_30 = 0xc8000004;
  local_b8.sa_handler = anon_unknown_70::crashHandler;
  do {
    iVar1 = sigaction(0xb,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2c32;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2c32:
  do {
    iVar1 = sigaction(7,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2c5b;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2c5b:
  do {
    iVar1 = sigaction(8,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2c84;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2c84:
  do {
    iVar1 = sigaction(6,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2cad;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2cad:
  do {
    iVar1 = sigaction(4,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2cd6;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2cd6:
  do {
    iVar1 = sigaction(0x1f,(sigaction *)&local_b8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_004a2cff;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d0.exception = (Exception *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d0);
  }
LAB_004a2cff:
  std::set_terminate(anon_unknown_70::terminateHandler);
  return;
}

Assistant:

void printStackTraceOnCrash() {
  // Set up alternate signal stack so that stack overflows can be handled.
  stack_t stack;
  memset(&stack, 0, sizeof(stack));

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
#ifndef MAP_GROWSDOWN
#define MAP_GROWSDOWN 0
#endif

  stack.ss_size = 65536;
  // Note: ss_sp is char* on FreeBSD, void* on Linux and OSX.
  stack.ss_sp = reinterpret_cast<char*>(mmap(
      nullptr, stack.ss_size, PROT_READ | PROT_WRITE,
      MAP_ANONYMOUS | MAP_PRIVATE | MAP_GROWSDOWN, -1, 0));
  KJ_SYSCALL(sigaltstack(&stack, nullptr));

  // Catch all relevant signals.
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_flags = SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND;
  action.sa_sigaction = &crashHandler;

  // Dump stack on common "crash" signals.
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));

  // Dump stack on unimplemented syscalls -- useful in seccomp sandboxes.
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  // Dump stack on keyboard interrupt -- useful for infinite loops. Only in debug mode, though,
  // because stack traces on ctrl+c can be obnoxious for, say, command-line tools.
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif

  // Also override std::terminate() handler with something nicer for KJ.
  std::set_terminate(&terminateHandler);
}